

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> * __thiscall
fmt::v8::detail::make_arg<fmt::v8::basic_format_context<fmt::v8::appender,char>,unsigned_char>
          (basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>
           *__return_storage_ptr__,detail *this,uchar *value)

{
  basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *arg;
  longlong local_48;
  size_t local_40;
  uchar *value_local;
  
  basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>::basic_format_arg
            (__return_storage_ptr__);
  __return_storage_ptr__->type_ = uint_type;
  local_48._0_4_ = (uint)(byte)*this;
  (__return_storage_ptr__->value_).field_0.long_long_value = local_48;
  (__return_storage_ptr__->value_).field_0.string.size = local_40;
  return __return_storage_ptr__;
}

Assistant:

FMT_CONSTEXPR auto make_arg(const T& value) -> basic_format_arg<Context> {
  basic_format_arg<Context> arg;
  arg.type_ = mapped_type_constant<T, Context>::value;
  arg.value_ = arg_mapper<Context>().map(value);
  return arg;
}